

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor *c)

{
  runner *prVar1;
  int iVar2;
  uint extraout_var;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  error_category *extraout_RDX_01;
  bool bVar3;
  error_code local_60;
  string out;
  
  (**c->_vptr_ICompressor)();
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&out);
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,out._M_dataplus._M_p);
  (*c->_vptr_ICompressor[7])(c,out._M_string_length);
  (*c->_vptr_ICompressor[0xc])(c,3);
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,(extraout_var & 1) == 0,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1d4,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)",
             (char *)0x0);
  (*c->_vptr_ICompressor[5])(c,0);
  (*c->_vptr_ICompressor[3])(c,0);
  iVar2 = (*c->_vptr_ICompressor[0xc])(c,5);
  prVar1 = test_suite::detail::current()::p;
  system::error_code::error_code<boost::deflate::error>(&local_60,end_of_stream,(type *)0x0);
  bVar3 = false;
  if (local_60.val_ == iVar2) {
    bVar3 = extraout_RDX->id_ == (local_60.cat_)->id_;
    if ((local_60.cat_)->id_ == 0) {
      bVar3 = extraout_RDX == local_60.cat_;
    }
  }
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar3,"ec == error::end_of_stream",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1d8,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)",
             (char *)0x0);
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,out._M_dataplus._M_p);
  (*c->_vptr_ICompressor[7])(c,out._M_string_length);
  iVar2 = (*c->_vptr_ICompressor[0xc])(c,3);
  prVar1 = test_suite::detail::current()::p;
  system::error_code::error_code<boost::deflate::error>(&local_60,stream_error,(type *)0x0);
  bVar3 = false;
  if (local_60.val_ == iVar2) {
    bVar3 = extraout_RDX_00->id_ == (local_60.cat_)->id_;
    if ((local_60.cat_)->id_ == 0) {
      bVar3 = extraout_RDX_00 == local_60.cat_;
    }
  }
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar3,"ec == error::stream_error",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1de,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)",
             (char *)0x0);
  iVar2 = (*c->_vptr_ICompressor[0xc])(c,5);
  prVar1 = test_suite::detail::current()::p;
  system::error_code::error_code<boost::deflate::error>(&local_60,need_buffers,(type *)0x0);
  bVar3 = false;
  if (local_60.val_ == iVar2) {
    bVar3 = extraout_RDX_01->id_ == (local_60.cat_)->id_;
    if ((local_60.cat_)->id_ == 0) {
      bVar3 = extraout_RDX_01 == local_60.cat_;
    }
  }
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar3,"ec == error::need_buffers",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1e0,
             "static void boost::deflate::deflate_stream_test::testWriteAfterFinish(ICompressor &)",
             (char *)0x0);
  std::__cxx11::string::~string((string *)&out);
  return;
}

Assistant:

static
    void testWriteAfterFinish(ICompressor& c)
    {
        c.init();
        std::string out;
        out.resize(1024);
        string_view s = "Hello";
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        error_code ec = c.write(Flush::sync);
        BOOST_TEST(!ec);
        c.next_in(nullptr);
        c.avail_in(0);
        ec = c.write(Flush::finish);
        BOOST_TEST(ec == error::end_of_stream);
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        ec = c.write(Flush::sync);
        BOOST_TEST(ec == error::stream_error);
        ec = c.write(Flush::finish);
        BOOST_TEST(ec == error::need_buffers);
    }